

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushAllowKeyboardFocus(bool allow_keyboard_focus)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  bool *__dest;
  ImGuiContext *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool *pbVar7;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  (pIVar2->DC).AllowKeyboardFocus = allow_keyboard_focus;
  iVar4 = (pIVar2->DC).AllowKeyboardFocusStack.Size;
  if (iVar4 != (pIVar2->DC).AllowKeyboardFocusStack.Capacity) {
    __dest = (pIVar2->DC).AllowKeyboardFocusStack.Data;
    goto LAB_0012b92e;
  }
  if (iVar4 == 0) {
    iVar5 = 8;
  }
  else {
    iVar5 = iVar4 / 2 + iVar4;
  }
  iVar6 = iVar4 + 1;
  if (iVar4 + 1 < iVar5) {
    iVar6 = iVar5;
  }
  piVar1 = &(pIVar3->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (bool *)(*(pIVar3->IO).MemAllocFn)((long)iVar6);
  pbVar7 = (pIVar2->DC).AllowKeyboardFocusStack.Data;
  if (pbVar7 == (bool *)0x0) {
LAB_0012b911:
    pbVar7 = (bool *)0x0;
    pIVar3 = GImGui;
  }
  else {
    memcpy(__dest,pbVar7,(long)(pIVar2->DC).AllowKeyboardFocusStack.Size);
    pIVar3 = GImGui;
    pbVar7 = (pIVar2->DC).AllowKeyboardFocusStack.Data;
    if (pbVar7 == (bool *)0x0) goto LAB_0012b911;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar3->IO).MemFreeFn)(pbVar7);
  (pIVar2->DC).AllowKeyboardFocusStack.Data = __dest;
  (pIVar2->DC).AllowKeyboardFocusStack.Capacity = iVar6;
  iVar4 = (pIVar2->DC).AllowKeyboardFocusStack.Size;
LAB_0012b92e:
  (pIVar2->DC).AllowKeyboardFocusStack.Size = iVar4 + 1;
  __dest[iVar4] = allow_keyboard_focus;
  return;
}

Assistant:

void ImGui::PushAllowKeyboardFocus(bool allow_keyboard_focus)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.AllowKeyboardFocus = allow_keyboard_focus;
    window->DC.AllowKeyboardFocusStack.push_back(allow_keyboard_focus);
}